

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshrec.c
# Opt level: O2

void ps_hints_t1reset(PS_Hints hints,FT_UInt end_point)

{
  FT_Memory memory;
  FT_Error FVar1;
  
  if (hints->error != 0) {
    return;
  }
  if (hints->hint_type == PS_HINT_TYPE_1) {
    memory = hints->memory;
    FVar1 = ps_dimension_reset_mask(hints->dimension,end_point,memory);
    if ((FVar1 == 0) &&
       (FVar1 = ps_dimension_reset_mask(hints->dimension + 1,end_point,memory), FVar1 == 0)) {
      return;
    }
  }
  else {
    FVar1 = 6;
  }
  hints->error = FVar1;
  return;
}

Assistant:

static void
  ps_hints_t1reset( PS_Hints  hints,
                    FT_UInt   end_point )
  {
    FT_Error  error = FT_Err_Ok;


    if ( !hints->error )
    {
      FT_Memory  memory = hints->memory;


      if ( hints->hint_type == PS_HINT_TYPE_1 )
      {
        error = ps_dimension_reset_mask( &hints->dimension[0],
                                         end_point, memory );
        if ( error )
          goto Fail;

        error = ps_dimension_reset_mask( &hints->dimension[1],
                                         end_point, memory );
        if ( error )
          goto Fail;
      }
      else
      {
        /* invalid hint type */
        error = FT_THROW( Invalid_Argument );
        goto Fail;
      }
    }
    return;

  Fail:
    hints->error = error;
  }